

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_corofile.cpp
# Opt level: O2

void test_seq_read_write<(coro_io::execution_type)2>(string_view filename)

{
  string_view filepath;
  uint pool_size;
  ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_> *executor;
  Lazy<std::pair<std::error_code,_unsigned_long>_> *lazy;
  Lazy<std::pair<std::error_code,_unsigned_long>_> *lazy_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  string_view buf_00;
  undefined1 local_350 [8];
  undefined1 local_348 [24];
  string str;
  size_t size;
  string_view filename_local;
  char buf [100];
  basic_seq_coro_file<(coro_io::execution_type)2> file;
  
  filename_local._M_str = filename._M_str;
  filename_local._M_len = filename._M_len;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&file,&filename_local,(allocator<char> *)&str);
  __l._M_len = 1;
  __l._M_array = (iterator)&file;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)buf,__l,(allocator_type *)local_348);
  create_files((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)buf,0xbe);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)buf);
  std::__cxx11::string::~string((string *)&file);
  filepath._M_str = filename_local._M_str;
  filepath._M_len = filename_local._M_len;
  pool_size = std::thread::hardware_concurrency();
  executor = coro_io::get_global_block_executor<coro_io::io_context_pool>(pool_size);
  coro_io::basic_seq_coro_file<(coro_io::execution_type)2>::basic_seq_coro_file
            (&file,filepath,_S_out|_S_in,executor);
  buf._0_8_ = &file;
  test_seq_read_write<(coro_io::execution_type)2>::anon_class_8_1_898ba27a::operator()
            ((anon_class_8_1_898ba27a *)buf);
  buf._0_8_ = &file;
  test_seq_read_write<(coro_io::execution_type)2>::anon_class_8_1_898ba27a::operator()
            ((anon_class_8_1_898ba27a *)buf);
  coro_io::basic_seq_coro_file<(coro_io::execution_type)2>::async_read
            ((basic_seq_coro_file<(coro_io::execution_type)2> *)local_348,(char *)&file,(size_t)buf)
  ;
  async_simple::coro::syncAwait<async_simple::coro::Lazy<std::pair<std::error_code,unsigned_long>>>
            ((pair<std::error_code,_unsigned_long> *)&str,(coro *)local_348,lazy);
  size = str.field_2._M_allocated_capacity;
  async_simple::coro::detail::LazyBase<std::pair<std::error_code,_unsigned_long>,_false>::~LazyBase
            ((LazyBase<std::pair<std::error_code,_unsigned_long>,_false> *)local_348);
  str._M_dataplus._M_p = (pointer)&size;
  test_seq_read_write<(coro_io::execution_type)2>::anon_class_8_1_89918cff::operator()
            ((anon_class_8_1_89918cff *)&str);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&str,"test",(allocator<char> *)local_348);
  buf_00._M_str = (char *)str._M_string_length;
  buf_00._M_len = (size_t)&file;
  coro_io::basic_seq_coro_file<(coro_io::execution_type)2>::async_write
            ((basic_seq_coro_file<(coro_io::execution_type)2> *)local_350,buf_00);
  async_simple::coro::syncAwait<async_simple::coro::Lazy<std::pair<std::error_code,unsigned_long>>>
            ((pair<std::error_code,_unsigned_long> *)local_348,(coro *)local_350,lazy_00);
  size = local_348._16_8_;
  async_simple::coro::detail::LazyBase<std::pair<std::error_code,_unsigned_long>,_false>::~LazyBase
            ((LazyBase<std::pair<std::error_code,_unsigned_long>,_false> *)local_350);
  local_348._0_8_ = &size;
  test_seq_read_write<(coro_io::execution_type)2>::anon_class_8_1_89918cff::operator()
            ((anon_class_8_1_89918cff *)local_348);
  std::__cxx11::string::~string((string *)&str);
  coro_io::basic_seq_coro_file<(coro_io::execution_type)2>::~basic_seq_coro_file(&file);
  return;
}

Assistant:

void test_seq_read_write(std::string_view filename) {
  create_files({std::string(filename)}, 190);
  coro_io::basic_seq_coro_file<execute_type> file(filename,
                                                  std::ios::in | std::ios::out);
  CHECK(file.is_open());
#if defined(ENABLE_FILE_IO_URING) || defined(ASIO_WINDOWS)
  if (execute_type == coro_io::execution_type::native_async) {
    CHECK(file.get_execution_type() == coro_io::execution_type::native_async);
  }
#else
  CHECK(file.get_execution_type() == coro_io::execution_type::thread_pool);
#endif
  char buf[100];
  std::error_code ec;
  size_t size;
  std::tie(ec, size) = async_simple::coro::syncAwait(file.async_read(buf, 10));
  CHECK(size == 10);

  std::string str = "test";
  std::tie(ec, size) = async_simple::coro::syncAwait(file.async_write(str));
  CHECK(size == 4);
}